

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controlbits.c
# Opt level: O0

void controlbitsfrompermutation(int w,int n,int step,int off,uchar *c,uint32_t *pi)

{
  uint uVar1;
  uint32_t *y;
  uint32_t step_00;
  byte bVar2;
  long lVar3;
  long lVar4;
  int n_00;
  uint32_t *puVar5;
  int iVar6;
  int w_00;
  uint32_t *puVar7;
  undefined8 uStack_100;
  uint32_t local_f8 [2];
  undefined8 local_f0;
  uint32_t *local_e8;
  int local_dc;
  uint32_t *local_d8;
  int local_d0;
  int local_cc;
  uchar *local_c8;
  long local_c0;
  uint32_t *local_b8;
  uint32_t *local_b0;
  uint32_t *local_a8;
  uint32_t *local_a0;
  long local_98;
  ulong local_90;
  long local_88;
  ulong local_78;
  unsigned_long __vla_expr6;
  unsigned_long __vla_expr5;
  unsigned_long __vla_expr4;
  unsigned_long __vla_expr3;
  unsigned_long __vla_expr2;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  int local_38;
  int local_34;
  int t;
  int k;
  int j;
  int i;
  uint32_t *pi_local;
  uchar *c_local;
  int off_local;
  int step_local;
  int n_local;
  int w_local;
  
  step_local = w;
  off_local = n;
  c_local._4_4_ = step;
  c_local._0_4_ = off;
  pi_local = (uint32_t *)c;
  _j = pi;
  __vla_expr0 = (unsigned_long)local_f8;
  local_c0 = (long)local_f8 - ((ulong)(uint)n * 4 + 0xf & 0xfffffffffffffff0);
  __vla_expr1 = (ulong)(uint)n;
  local_b8 = (uint32_t *)(local_c0 - ((ulong)(uint)(n * 2) * 4 + 0xf & 0xfffffffffffffff0));
  __vla_expr2 = (ulong)(uint)(n * 2);
  local_b0 = (uint32_t *)((long)local_b8 - ((ulong)(uint)(n * 2) * 4 + 0xf & 0xfffffffffffffff0));
  __vla_expr3 = (ulong)(uint)(n * 2);
  local_a8 = (uint32_t *)((long)local_b0 - ((ulong)(uint)(n * 2) * 4 + 0xf & 0xfffffffffffffff0));
  __vla_expr4 = (ulong)(uint)(n * 2);
  local_a0 = (uint32_t *)((long)local_a8 - ((ulong)(uint)(n * 2) * 4 + 0xf & 0xfffffffffffffff0));
  __vla_expr5 = (ulong)(uint)(n * 2);
  local_98 = (long)local_a0 - ((ulong)(uint)n * 4 + 0xf & 0xfffffffffffffff0);
  __vla_expr6 = (ulong)(uint)n;
  local_90 = (ulong)(uint)(n / 2);
  lVar3 = local_98 - (local_90 * 8 + 0xf & 0xfffffffffffffff0);
  local_88 = lVar3;
  local_78 = local_90;
  if (w == 1) {
    local_c8 = c;
    c[off / 8] = c[off / 8] | (byte)((*pi & 1) << ((byte)((long)off % 8) & 0x1f));
  }
  if (1 < w) {
    *(undefined8 *)(lVar3 + -8) = 0x10410e;
    invert(*(int *)(lVar3 + 0x1c),*(uint32_t **)(lVar3 + 0x10),*(uint32_t **)(lVar3 + 8));
    for (k = 0; bVar2 = (byte)step_local, k < off_local; k = k + 1) {
      local_b8[k] = *(uint *)(local_c0 + (long)k * 4) | 1 << (bVar2 & 0x1f);
      local_b8[off_local + k] = _j[k];
    }
    for (k = 0; SBORROW4(k,off_local * 2) != k + off_local * -2 < 0; k = k + 1) {
      local_cc = k;
      local_b0[k] = (k >> (bVar2 & 0x1f)) + (k & (1 << (bVar2 & 0x1f)) - 2U) +
                    ((k & 1U) << (bVar2 & 0x1f));
    }
    for (local_38 = 0; y = local_a8, puVar7 = local_b0, puVar5 = local_b8, local_38 < step_local;
        local_38 = local_38 + 1) {
      iVar6 = off_local << 1;
      *(undefined8 *)(lVar3 + -8) = 0x1041fe;
      composeinv(iVar6,y,puVar7,puVar5);
      for (k = 0; puVar7 = local_a0, puVar5 = local_b8,
          SBORROW4(k,off_local * 2) != k + off_local * -2 < 0; k = k + 1) {
        *(undefined8 *)(lVar3 + -8) = 0x104240;
        flow(*(int *)(lVar3 + 0x1c),*(uint32_t **)(lVar3 + 0x10),*(uint32_t **)(lVar3 + 8),
             *(int *)(lVar3 + 4));
      }
      for (k = 0; SBORROW4(k,off_local * 2) != k + off_local * -2 < 0; k = k + 1) {
        local_a0[k] = local_b8[(int)(k ^ 1)];
      }
      iVar6 = off_local << 1;
      *(undefined8 *)(lVar3 + -8) = 0x1042a5;
      composeinv(iVar6,puVar5,puVar5,puVar7);
      for (k = 0; SBORROW4(k,off_local * 2) != k + off_local * -2 < 0; k = k + 1) {
        local_a0[k] = local_b0[(int)(k ^ 1)];
      }
      for (k = 0; SBORROW4(k,off_local * 2) != k + off_local * -2 < 0; k = k + 1) {
        *(undefined8 *)(lVar3 + -8) = 0x104328;
        flow(*(int *)(lVar3 + 0x1c),*(uint32_t **)(lVar3 + 0x10),*(uint32_t **)(lVar3 + 8),
             *(int *)(lVar3 + 4));
      }
    }
    for (k = 0; k < off_local; k = k + 1) {
      for (t = 0; t < step_local; t = t + 1) {
        *(uint32_t *)(local_98 + (long)k * 4) = _j[k];
      }
    }
    k = 0;
    while( true ) {
      local_d0 = k;
      if (off_local / 2 <= k) break;
      local_d8 = pi_local;
      lVar4 = (long)(((int)c_local + k * c_local._4_4_) / 8);
      *(byte *)((long)pi_local + lVar4) =
           *(byte *)((long)pi_local + lVar4) |
           (byte)((local_b0[k << 1] >> ((byte)step_local & 0x1f) & 1) <<
                 ((byte)((long)((int)c_local + k * c_local._4_4_) % 8) & 0x1f));
      k = k + 1;
    }
    for (k = 0; local_dc = k, k < off_local / 2; k = k + 1) {
      local_e8 = pi_local;
      lVar4 = (long)(((int)c_local + ((step_local + -1) * off_local + k) * c_local._4_4_) / 8);
      *(byte *)((long)pi_local + lVar4) =
           *(byte *)((long)pi_local + lVar4) |
           (byte)((local_b0[off_local + k * 2] >> ((byte)step_local & 0x1f) & 1) <<
                 ((byte)((long)((int)c_local + ((step_local + -1) * off_local + k) * c_local._4_4_)
                        % 8) & 0x1f));
    }
    for (k = 0; local_f0._4_4_ = k, k < off_local / 2; k = k + 1) {
      puVar7 = (uint32_t *)(local_98 + (long)(k << 1) * 4);
      puVar5 = (uint32_t *)(local_98 + (long)(k * 2 + 1) * 4);
      uVar1 = local_b0[off_local + k * 2];
      bVar2 = (byte)step_local;
      *(undefined8 *)(lVar3 + -8) = 0x10455e;
      cswap(puVar7,puVar5,(byte)(uVar1 >> (bVar2 & 0x1f)) & 1);
    }
    for (local_34 = 0; local_34 < 2; local_34 = local_34 + 1) {
      for (k = 0; local_f0._0_4_ = k, k < off_local / 2; k = k + 1) {
        *(uint *)(local_88 + (long)local_34 * local_90 * 4 + (long)k * 4) =
             *(uint *)(local_98 + (long)(k * 2 + local_34) * 4) >> 1;
      }
    }
    for (local_34 = 0; puVar5 = pi_local, local_34 < 2; local_34 = local_34 + 1) {
      w_00 = step_local + -1;
      n_00 = off_local / 2;
      step_00 = c_local._4_4_ << 1;
      local_f8[1] = c_local._4_4_;
      iVar6 = (int)c_local + c_local._4_4_ * (off_local / 2 + local_34);
      puVar7 = (uint32_t *)(local_88 + (long)local_34 * local_90 * 4);
      local_f8[0] = step_00;
      *(undefined8 *)(lVar3 + -8) = 0x104671;
      controlbitsfrompermutation(w_00,n_00,step_00,iVar6,(uchar *)puVar5,puVar7);
    }
  }
  return;
}

Assistant:

static void controlbitsfrompermutation(int w, int n, int step, int off, unsigned char *c, uint32_t pi[n])
{
  int i;
  int j;
  int k;
  int t;
  uint32_t ip[n];
  uint32_t I[2 * n];
  uint32_t P[2 * n];
  uint32_t PI[2 * n];
  uint32_t T[2 * n];
  uint32_t piflip[n];
  uint32_t subpi[2][n / 2];

  if (w == 1) c[ off/8 ] |= (pi[0] & 1) << (off%8);
  if (w <= 1) return;

  invert(n,ip,pi);

  for (i = 0;i < n;++i) 
  {
    I[i] = ip[i] | (1 << w);
    I[n + i] = pi[i];
  }

  for (i = 0;i < 2 * n;++i)
      P[i] = (i >> w) + (i & ((1<<w)-2)) + ((i & 1) << w);

  for (t = 0;t < w;++t) 
  {
    composeinv(2 * n,PI,P,I);

    for (i = 0;i < 2 * n;++i)
      flow(w,&P[i],&PI[i],t);

    for (i = 0;i < 2 * n;++i)
	T[i] = I[i ^ 1];

    composeinv(2 * n,I,I,T);

    for (i = 0;i < 2 * n;++i)
	T[i] = P[i ^ 1];

    for (i = 0;i < 2 * n;++i)
      flow(w,&P[i],&T[i],1);
  }

  for (i = 0;i < n;++i)
    for (j = 0;j < w;++j)
      piflip[i] = pi[i];

  for (i = 0;i < n / 2;++i) c[ (off + i * step)/8 ] |= ((P[i * 2] >> w) & 1) << ((off + i * step)%8);
  for (i = 0;i < n / 2;++i) c[ (off + ((w-1)*n + i) * step)/8 ] |= ((P[n + i * 2] >> w) & 1) << ((off + ((w-1)*n + i) * step)%8);

  for (i = 0;i < n / 2;++i)
    cswap(&piflip[i * 2], &piflip[i * 2 + 1], (P[n + i * 2] >> w) & 1);

  for (k = 0;k < 2;++k)
    for (i = 0;i < n / 2;++i)
        subpi[k][i] = piflip[i * 2 + k] >> 1;

  for (k = 0;k < 2;++k)
    controlbitsfrompermutation(w - 1, n / 2, step * 2, off + step * (n/2 + k), c, subpi[k]);
}